

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_data.cc
# Opt level: O0

void CRYPTO_free_ex_data(int class_index,void *obj,CRYPTO_EX_DATA *ad)

{
  uint32_t uVar1;
  int idx;
  void *pvVar2;
  undefined4 in_register_0000003c;
  long lVar3;
  void *ptr;
  int index;
  uint32_t i;
  CRYPTO_EX_DATA_FUNCS **funcs;
  uint32_t num_funcs;
  CRYPTO_EX_DATA *ad_local;
  void *obj_local;
  CRYPTO_EX_DATA_CLASS *ex_data_class_local;
  
  lVar3 = CONCAT44(in_register_0000003c,class_index);
  if (ad->sk != (stack_st_void *)0x0) {
    uVar1 = CRYPTO_atomic_load_u32((CRYPTO_atomic_u32 *)(lVar3 + 0x48));
    if ((ulong)(long)(int)(0x7fffffff - (uint)*(byte *)(lVar3 + 0x4c)) < (ulong)uVar1) {
      __assert_fail("num_funcs <= (size_t)(INT_MAX - ex_data_class->num_reserved)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ex_data.cc"
                    ,0x7b,
                    "void CRYPTO_free_ex_data(CRYPTO_EX_DATA_CLASS *, void *, CRYPTO_EX_DATA *)");
    }
    _index = (long *)(lVar3 + 0x38);
    for (ptr._4_4_ = 0; ptr._4_4_ < uVar1; ptr._4_4_ = ptr._4_4_ + 1) {
      if (*(long *)(*_index + 0x10) != 0) {
        idx = ptr._4_4_ + *(byte *)(lVar3 + 0x4c);
        pvVar2 = CRYPTO_get_ex_data(ad,idx);
        (**(code **)(*_index + 0x10))
                  (obj,pvVar2,ad,idx,*(undefined8 *)*_index,*(undefined8 *)(*_index + 8));
      }
      _index = (long *)(*_index + 0x18);
    }
    sk_void_free((stack_st_void *)ad->sk);
    ad->sk = (stack_st_void *)0x0;
  }
  return;
}

Assistant:

void CRYPTO_free_ex_data(CRYPTO_EX_DATA_CLASS *ex_data_class, void *obj,
                         CRYPTO_EX_DATA *ad) {
  if (ad->sk == NULL) {
    // Nothing to do.
    return;
  }

  uint32_t num_funcs = CRYPTO_atomic_load_u32(&ex_data_class->num_funcs);
  // |CRYPTO_get_ex_new_index_ex| will not allocate indices beyond |INT_MAX|.
  assert(num_funcs <= (size_t)(INT_MAX - ex_data_class->num_reserved));

  // Defer dereferencing |ex_data_class->funcs| and |funcs->next|. It must come
  // after the |num_funcs| comparison to be correctly synchronized.
  CRYPTO_EX_DATA_FUNCS *const *funcs = &ex_data_class->funcs;
  for (uint32_t i = 0; i < num_funcs; i++) {
    if ((*funcs)->free_func != NULL) {
      int index = (int)i + ex_data_class->num_reserved;
      void *ptr = CRYPTO_get_ex_data(ad, index);
      (*funcs)->free_func(obj, ptr, ad, index, (*funcs)->argl, (*funcs)->argp);
    }
    funcs = &(*funcs)->next;
  }

  sk_void_free(ad->sk);
  ad->sk = NULL;
}